

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

MainFunc __thiscall capnp::compiler::CompilerMain::getMain(CompilerMain *this)

{
  ProcessContext *pPVar1;
  StringPtr extendedDescription;
  StringPtr extendedDescription_00;
  StringPtr helpText;
  StringPtr helpText_00;
  StringPtr helpText_01;
  StringPtr helpText_02;
  StringPtr helpText_03;
  StringPtr briefDescription;
  StringPtr version;
  initializer_list<kj::MainBuilder::OptionName> names;
  StringPtr briefDescription_00;
  StringPtr version_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MainBuilder *pMVar4;
  Type *func;
  Type *func_00;
  Type *func_01;
  Type *func_02;
  Type *func_03;
  Iface *extraout_RDX;
  Iface *extraout_RDX_00;
  Iface *pIVar5;
  CompilerMain *in_RSI;
  MainFunc MVar6;
  bool local_301;
  ArrayPtr<const_char> local_300;
  undefined1 local_2ea [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:110:37),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:110:37)>
  local_2e8;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> local_2d8;
  ArrayPtr<const_char> local_2c8;
  StringPtr local_2b8;
  undefined1 local_2a2 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:108:39),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:108:39)>
  local_2a0;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> local_290;
  StringPtr local_280;
  StringPtr local_270;
  undefined1 local_25a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:106:39),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:106:39)>
  local_258;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> local_248;
  StringPtr local_238;
  StringPtr local_228;
  undefined1 local_212 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:104:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:104:40)>
  local_210;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> local_200;
  StringPtr local_1f0;
  StringPtr local_1e0;
  undefined1 local_1ca [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:102:35),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:102:35)>
  local_1c8;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> local_1b8;
  StringPtr local_1a8;
  StringPtr local_198;
  undefined1 local_182 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:100:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:100:40)>
  local_180;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> local_170;
  StringPtr local_160;
  StringPtr local_150;
  StringPtr local_140;
  StringPtr local_130;
  undefined1 local_120 [8];
  MainBuilder builder_1;
  undefined1 local_fa [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:94:47),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:94:47)>
  local_f8;
  Function<kj::MainBuilder::Validity_()> local_e8;
  OptionName local_d8;
  OptionName local_c8 [3];
  StringPtr local_98;
  StringPtr local_88;
  StringPtr local_78;
  undefined1 local_68 [8];
  MainBuilder builder;
  StringPtr local_48;
  StringPtr local_38;
  StringPtr local_28;
  CompilerMain *this_local;
  
  this_local = this;
  iVar3 = (**in_RSI->context->_vptr_ProcessContext)();
  local_28.content.ptr = (char *)CONCAT44(extraout_var,iVar3);
  kj::StringPtr::StringPtr(&local_38,"capnpc");
  bVar2 = kj::StringPtr::endsWith(&local_28,&local_38);
  local_301 = true;
  if (!bVar2) {
    iVar3 = (**in_RSI->context->_vptr_ProcessContext)();
    local_48.content.ptr = (char *)CONCAT44(extraout_var_00,iVar3);
    kj::StringPtr::StringPtr((StringPtr *)&builder.impl.ptr,"capnpc.exe");
    local_301 = kj::StringPtr::endsWith(&local_48,(StringPtr *)&builder.impl.ptr);
  }
  if (local_301 == false) {
    pPVar1 = in_RSI->context;
    kj::StringPtr::StringPtr(&local_130,"Cap\'n Proto version 2.0-dev");
    kj::StringPtr::StringPtr
              (&local_140,"Command-line tool for Cap\'n Proto development and debugging.");
    kj::StringPtr::StringPtr(&local_150,(void *)0x0);
    version.content.size_ = local_130.content.size_;
    version.content.ptr = local_130.content.ptr;
    briefDescription.content.size_ = local_140.content.size_;
    briefDescription.content.ptr = local_140.content.ptr;
    extendedDescription_00.content.size_ = local_150.content.size_;
    extendedDescription_00.content.ptr = local_150.content.ptr;
    kj::MainBuilder::MainBuilder
              ((MainBuilder *)local_120,pPVar1,version,briefDescription,extendedDescription_00);
    kj::StringPtr::StringPtr(&local_160,"compile");
    local_180.t = (CompilerMain *)
                  kj::_::
                  boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_4_>
                            ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:100:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:100:40)>
                              *)in_RSI,(_ *)(local_182 + 1),(CompilerMain *)local_182,
                             (Type *)local_130.content.size_,(Type *)local_140.content.ptr);
    kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::
    Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
              ((Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()> *)
               &local_170,&local_180);
    kj::StringPtr::StringPtr(&local_198,"Generate source code from schema files.");
    helpText_03.content.size_ = local_198.content.size_;
    helpText_03.content.ptr = local_198.content.ptr;
    func = (Type *)&local_170;
    pMVar4 = kj::MainBuilder::addSubCommand
                       ((MainBuilder *)local_120,local_160,
                        (Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                         *)func,helpText_03);
    kj::StringPtr::StringPtr(&local_1a8,"id");
    local_1c8.t = (CompilerMain *)
                  kj::_::
                  boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_6_>
                            ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:102:35),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:102:35)>
                              *)in_RSI,(_ *)(local_1ca + 1),(CompilerMain *)local_1ca,func,
                             (Type *)local_198.content.ptr);
    kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::
    Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
              ((Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()> *)
               &local_1b8,&local_1c8);
    kj::StringPtr::StringPtr(&local_1e0,"Generate a new unique ID.");
    helpText_02.content.size_ = local_1e0.content.size_;
    helpText_02.content.ptr = local_1e0.content.ptr;
    func_00 = (Type *)&local_1b8;
    pMVar4 = kj::MainBuilder::addSubCommand
                       (pMVar4,local_1a8,
                        (Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                         *)func_00,helpText_02);
    kj::StringPtr::StringPtr(&local_1f0,"convert");
    local_210.t = (CompilerMain *)
                  kj::_::
                  boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_8_>
                            ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:104:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:104:40)>
                              *)in_RSI,(_ *)(local_212 + 1),(CompilerMain *)local_212,func_00,
                             (Type *)local_1e0.content.ptr);
    kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::
    Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_8_>>
              ((Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()> *)
               &local_200,&local_210);
    kj::StringPtr::StringPtr(&local_228,"Convert messages between binary, text, JSON, etc.");
    helpText_01.content.size_ = local_228.content.size_;
    helpText_01.content.ptr = local_228.content.ptr;
    func_01 = (Type *)&local_200;
    pMVar4 = kj::MainBuilder::addSubCommand
                       (pMVar4,local_1f0,
                        (Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                         *)func_01,helpText_01);
    kj::StringPtr::StringPtr(&local_238,"decode");
    local_258.t = (CompilerMain *)
                  kj::_::
                  boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_10_>
                            ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:106:39),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:106:39)>
                              *)in_RSI,(_ *)(local_25a + 1),(CompilerMain *)local_25a,func_01,
                             (Type *)local_228.content.ptr);
    kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::
    Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_10_>>
              ((Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()> *)
               &local_248,&local_258);
    kj::StringPtr::StringPtr(&local_270,"DEPRECATED (use `convert`)");
    helpText_00.content.size_ = local_270.content.size_;
    helpText_00.content.ptr = local_270.content.ptr;
    func_02 = (Type *)&local_248;
    pMVar4 = kj::MainBuilder::addSubCommand
                       (pMVar4,local_238,
                        (Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                         *)func_02,helpText_00);
    kj::StringPtr::StringPtr(&local_280,"encode");
    local_2a0.t = (CompilerMain *)
                  kj::_::
                  boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_12_>
                            ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:108:39),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:108:39)>
                              *)in_RSI,(_ *)(local_2a2 + 1),(CompilerMain *)local_2a2,func_02,
                             (Type *)local_270.content.ptr);
    kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::
    Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_12_>>
              ((Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()> *)
               &local_290,&local_2a0);
    kj::StringPtr::StringPtr(&local_2b8,"DEPRECATED (use `convert`)");
    helpText.content.size_ = local_2b8.content.size_;
    helpText.content.ptr = local_2b8.content.ptr;
    func_03 = (Type *)&local_290;
    pMVar4 = kj::MainBuilder::addSubCommand
                       (pMVar4,local_280,
                        (Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
                         *)func_03,helpText);
    kj::StringPtr::StringPtr((StringPtr *)&local_2c8,"eval");
    local_2e8.t = (CompilerMain *)
                  kj::_::
                  boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_13_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_14_>
                            ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:110:37),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:110:37)>
                              *)in_RSI,(_ *)(local_2ea + 1),(CompilerMain *)local_2ea,func_03,
                             (Type *)local_2b8.content.ptr);
    kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::
    Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_13_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_14_>>
              ((Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()> *)
               &local_2d8,&local_2e8);
    kj::StringPtr::StringPtr((StringPtr *)&local_300,"Evaluate a const from a schema file.");
    kj::MainBuilder::addSubCommand(pMVar4,(StringPtr)local_2c8,&local_2d8,(StringPtr)local_300);
    kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::
    ~Function(&local_2d8);
    kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::
    ~Function(&local_290);
    kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::
    ~Function(&local_248);
    kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::
    ~Function(&local_200);
    kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::
    ~Function(&local_1b8);
    kj::Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::
    ~Function(&local_170);
    addGlobalOptions(in_RSI,(MainBuilder *)local_120);
    kj::MainBuilder::build((MainBuilder *)this);
    kj::MainBuilder::~MainBuilder((MainBuilder *)local_120);
    pIVar5 = extraout_RDX_00;
  }
  else {
    pPVar1 = in_RSI->context;
    kj::StringPtr::StringPtr(&local_78,"Cap\'n Proto version 2.0-dev");
    kj::StringPtr::StringPtr
              (&local_88,
               "Compiles Cap\'n Proto schema files and generates corresponding source code in one or more languages."
              );
    kj::StringPtr::StringPtr(&local_98,(void *)0x0);
    version_00.content.size_ = local_78.content.size_;
    version_00.content.ptr = local_78.content.ptr;
    briefDescription_00.content.size_ = local_88.content.size_;
    briefDescription_00.content.ptr = local_88.content.ptr;
    extendedDescription.content.size_ = local_98.content.size_;
    extendedDescription.content.ptr = local_98.content.ptr;
    kj::MainBuilder::MainBuilder
              ((MainBuilder *)local_68,pPVar1,version_00,briefDescription_00,extendedDescription);
    addGlobalOptions(in_RSI,(MainBuilder *)local_68);
    addCompileOptions(in_RSI,(MainBuilder *)local_68);
    kj::MainBuilder::OptionName::OptionName(&local_d8,'i');
    kj::MainBuilder::OptionName::OptionName(local_c8,"generate-id");
    local_c8[1]._0_8_ = &local_d8;
    local_c8[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x2;
    local_f8.t = (CompilerMain *)
                 kj::_::
                 boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_2_>
                           ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:94:47),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:94:47)>
                             *)in_RSI,(_ *)(local_fa + 1),(CompilerMain *)local_fa,
                            (Type *)local_78.content.size_,(Type *)local_88.content.ptr);
    kj::Function<kj::MainBuilder::Validity()>::
    Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
              ((Function<kj::MainBuilder::Validity()> *)&local_e8,&local_f8);
    kj::StringPtr::StringPtr
              ((StringPtr *)&builder_1.impl.ptr,
               "Generate a new 64-bit unique ID for use in a Cap\'n Proto schema.");
    names._M_len = (size_type)local_c8[1].field_1;
    names._M_array = (iterator)local_c8[1]._0_8_;
    kj::MainBuilder::addOption
              ((MainBuilder *)local_68,names,&local_e8,(StringPtr)stack0xfffffffffffffef0);
    kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_e8);
    kj::MainBuilder::build((MainBuilder *)this);
    kj::MainBuilder::~MainBuilder((MainBuilder *)local_68);
    pIVar5 = extraout_RDX;
  }
  MVar6.impl.ptr = pIVar5;
  MVar6.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar6.impl;
}

Assistant:

kj::MainFunc getMain() {
    if (context.getProgramName().endsWith("capnpc") || context.getProgramName().endsWith("capnpc.exe")) {
      kj::MainBuilder builder(context, VERSION_STRING,
            "Compiles Cap'n Proto schema files and generates corresponding source code in one or "
            "more languages.");
      addGlobalOptions(builder);
      addCompileOptions(builder);
      builder.addOption({'i', "generate-id"}, KJ_BIND_METHOD(*this, generateId),
                        "Generate a new 64-bit unique ID for use in a Cap'n Proto schema.");
      return builder.build();
    } else {
      kj::MainBuilder builder(context, VERSION_STRING,
            "Command-line tool for Cap'n Proto development and debugging.");
      builder.addSubCommand("compile", KJ_BIND_METHOD(*this, getCompileMain),
                            "Generate source code from schema files.")
             .addSubCommand("id", KJ_BIND_METHOD(*this, getGenIdMain),
                            "Generate a new unique ID.")
             .addSubCommand("convert", KJ_BIND_METHOD(*this, getConvertMain),
                            "Convert messages between binary, text, JSON, etc.")
             .addSubCommand("decode", KJ_BIND_METHOD(*this, getDecodeMain),
                            "DEPRECATED (use `convert`)")
             .addSubCommand("encode", KJ_BIND_METHOD(*this, getEncodeMain),
                            "DEPRECATED (use `convert`)")
             .addSubCommand("eval", KJ_BIND_METHOD(*this, getEvalMain),
                            "Evaluate a const from a schema file.");
      addGlobalOptions(builder);
      return builder.build();
    }
  }